

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O0

vm_lookup_ext * vm_lookup_ext::alloc_ext(CVmObjLookupTable *self,uint bucket_cnt,uint value_cnt)

{
  int iVar1;
  CVmVarHeap *pCVar2;
  undefined4 extraout_var;
  uint in_EDX;
  uint in_ESI;
  undefined8 in_RDI;
  vm_lookup_ext *ext;
  size_t siz;
  vm_lookup_ext *pvVar3;
  
  pCVar2 = CVmMemory::get_var_heap(G_mem_X);
  iVar1 = (*pCVar2->_vptr_CVmVarHeap[4])
                    (pCVar2,(ulong)(in_ESI - 1) * 8 + 0x28 + (ulong)in_EDX * 0x28,in_RDI);
  pvVar3 = (vm_lookup_ext *)CONCAT44(extraout_var,iVar1);
  pvVar3->bucket_cnt = in_ESI;
  pvVar3->value_cnt = in_EDX;
  vm_val_t::set_nil(&pvVar3->default_value);
  return pvVar3;
}

Assistant:

vm_lookup_ext *vm_lookup_ext::alloc_ext(VMG_ CVmObjLookupTable *self,
                                        uint bucket_cnt, uint value_cnt)
{
    size_t siz;
    vm_lookup_ext *ext;

    /* calculate how much space we need */
    siz = sizeof(vm_lookup_ext)
          + (bucket_cnt - 1) * sizeof(ext->buckets[0])
          + value_cnt * sizeof(vm_lookup_val);

    /* allocate the memory */
    ext = (vm_lookup_ext *)G_mem->get_var_heap()->alloc_mem(siz, self);

    /* remember the table sizes */
    ext->bucket_cnt = bucket_cnt;
    ext->value_cnt = value_cnt;

    /* set the default value to nil initially */
    ext->default_value.set_nil();

    /* return the new extension */
    return ext;
}